

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiPassResourceTracker::registerBuffer
          (QRhiPassResourceTracker *this,QRhiBuffer *buf,int slot,BufferAccess *access,
          BufferStage *stage,UsageState *state)

{
  bool bVar1;
  BufferStage BVar2;
  Buffer *pBVar3;
  char *pcVar4;
  BufferAccess *in_RCX;
  undefined8 in_RSI;
  QMessageLogger *in_RDI;
  BufferStage *in_R8;
  long in_FS_OFFSET;
  Buffer b;
  QByteArray name;
  iterator it;
  QRhiResource *in_stack_ffffffffffffff28;
  BufferStage in_stack_ffffffffffffff30;
  BufferStage in_stack_ffffffffffffff34;
  iterator *in_stack_ffffffffffffff38;
  char local_68 [32];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  piter local_30;
  piter local_20;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d = (Data<QHashPrivate::Node<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_10 = in_RSI;
  local_20 = (piter)QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::find
                              ((QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (QRhiBuffer **)in_stack_ffffffffffffff28);
  local_30 = (piter)QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::end
                              ((QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer> *)
                               in_stack_ffffffffffffff38);
  bVar1 = QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator!=
                    (in_stack_ffffffffffffff38,
                     (iterator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (bVar1) {
    pBVar3 = QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator->
                       ((iterator *)0x698826);
    if (pBVar3->access == *in_RCX) {
      pBVar3 = QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator->
                         ((iterator *)0x6988df);
      if (pBVar3->stage != *in_R8) {
        QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator->
                  ((iterator *)0x6988f8);
        BVar2 = earlierStage(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
        pBVar3 = QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator->
                           ((iterator *)0x698918);
        pBVar3->stage = BVar2;
        pBVar3 = QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::iterator::operator->
                           ((iterator *)0x69892c);
        *in_R8 = pBVar3->stage;
      }
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QRhiResource::name(in_stack_ffffffffffffff28);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                 (char *)in_stack_ffffffffffffff28);
      pcVar4 = QByteArray::constData((QByteArray *)0x6988a5);
      QMessageLogger::warning
                (local_68,
                 "Buffer %p (%s) used with different accesses within the same pass, this is not allowed."
                 ,local_10,pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x6988cd);
    }
  }
  else {
    QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>::insert
              ((QHash<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (QRhiBuffer **)in_stack_ffffffffffffff28,(Buffer *)0x6989a5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiPassResourceTracker::registerBuffer(QRhiBuffer *buf, int slot, BufferAccess *access, BufferStage *stage,
                                             const UsageState &state)
{
    auto it = m_buffers.find(buf);
    if (it != m_buffers.end()) {
        if (it->access != *access) {
            const QByteArray name = buf->name();
            qWarning("Buffer %p (%s) used with different accesses within the same pass, this is not allowed.",
                     buf, name.constData());
            return;
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Buffer b;
    b.slot = slot;
    b.access = *access;
    b.stage = *stage;
    b.stateAtPassBegin = state; // first use -> initial state
    m_buffers.insert(buf, b);
}